

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocators.hh
# Opt level: O3

intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::state_t,_unsigned_long,_1UL>_>
__thiscall
tchecker::ta::details::
state_pool_allocator_t<tchecker::make_shared_t<tchecker::ta::state_t,_unsigned_long,_1UL>_>::
construct_from_state<>
          (state_pool_allocator_t<tchecker::make_shared_t<tchecker::ta::state_t,_unsigned_long,_1UL>_>
           *this,make_shared_t<tchecker::ta::state_t,_unsigned_long,_1UL> *s)

{
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::intval_t,_unsigned_long,_1UL>_> *in_RDX;
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::intval_t,_unsigned_long,_1UL>_> iStack_28
  ;
  
  if (in_RDX[1]._t != (make_shared_t<tchecker::intval_t,_unsigned_long,_1UL> *)0x0) {
    pool_t<tchecker::make_shared_t<tchecker::intval_t,unsigned_long,1ul>>::
    construct<tchecker::intval_t_const&>
              ((pool_t<tchecker::make_shared_t<tchecker::intval_t,unsigned_long,1ul>> *)&iStack_28,
               (intval_t *)(s + 0xd));
    syncprod::details::
    state_pool_allocator_t<tchecker::make_shared_t<tchecker::ta::state_t,unsigned_long,1ul>>::
    construct_from_state<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::intval_t,unsigned_long,1ul>>>
              ((state_pool_allocator_t<tchecker::make_shared_t<tchecker::ta::state_t,unsigned_long,1ul>>
                *)this,s,in_RDX);
    intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::intval_t,_unsigned_long,_1UL>_>::
    ~intrusive_shared_ptr_t(&iStack_28);
    return (intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::state_t,_unsigned_long,_1UL>_>
            )(make_shared_t<tchecker::ta::state_t,_unsigned_long,_1UL> *)this;
  }
  __assert_fail("_t != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/shared_objects.hh"
                ,0x1d0,
                "T &tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::intval_t>>::operator*() const [T = tchecker::make_shared_t<tchecker::intval_t>]"
               );
}

Assistant:

tchecker::intrusive_shared_ptr_t<STATE> construct_from_state(STATE const & s, ARGS &&... args)
  {
    return tchecker::syncprod::details::state_pool_allocator_t<STATE>::construct_from_state(
        s, _intval_pool.construct(s.intval()), args...);
  }